

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

double P_GetMoveFactor(AActor *mo,double *frictionp)

{
  double dVar1;
  double dVar2;
  double velocity;
  double friction;
  double movefactor;
  double *frictionp_local;
  AActor *mo_local;
  
  movefactor = (double)frictionp;
  frictionp_local = (double *)mo;
  dVar1 = P_GetFriction(mo,&friction);
  if (dVar1 < 0.90625) {
    dVar2 = AActor::VelXYToSpeed((AActor *)frictionp_local);
    if (dVar2 <= 0.91552734375) {
      if (dVar2 <= 0.457763671875) {
        if (0.2288818359375 < dVar2) {
          friction = friction * 2.0;
        }
      }
      else {
        friction = friction * 4.0;
      }
    }
    else {
      friction = friction * 8.0;
    }
  }
  if (movefactor != 0.0) {
    *(double *)movefactor = dVar1;
  }
  return friction;
}

Assistant:

double P_GetMoveFactor(const AActor *mo, double *frictionp)
{
	double movefactor, friction;

	// If the floor is icy or muddy, it's harder to get moving. This is where
	// the different friction factors are applied to 'trying to move'. In
	// p_mobj.c, the friction factors are applied as you coast and slow down.

	if ((friction = P_GetFriction(mo, &movefactor)) < ORIG_FRICTION)
	{
		// phares 3/11/98: you start off slowly, then increase as
		// you get better footing

		double velocity = mo->VelXYToSpeed();

		if (velocity > MORE_FRICTION_VELOCITY * 4)
			movefactor *= 8;
		else if (velocity > MORE_FRICTION_VELOCITY * 2)
			movefactor *= 4;
		else if (velocity > MORE_FRICTION_VELOCITY)
			movefactor *= 2;
	}

	if (frictionp)
		*frictionp = friction;

	return movefactor;
}